

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palobjbase.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CPalObjectBase::Initialize(CPalObjectBase *this,CPalThread *pthr,CObjectAttributes *poa)

{
  DWORD DVar1;
  void *pvVar2;
  PAL_ERROR local_24;
  PAL_ERROR palError;
  CObjectAttributes *poa_local;
  CPalThread *pthr_local;
  CPalObjectBase *this_local;
  
  local_24 = 0;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","Initialize",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/palobjbase.cpp"
            ,0x33);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (poa == (CObjectAttributes *)0x0) {
    fprintf(_stderr,"] %s %s:%d","Initialize",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/palobjbase.cpp"
            ,0x34);
    fprintf(_stderr,"Expression: NULL != poa\n");
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  DVar1 = CObjectType::GetImmutableDataSize(this->m_pot);
  if (DVar1 != 0) {
    DVar1 = CObjectType::GetImmutableDataSize(this->m_pot);
    pvVar2 = InternalMalloc((ulong)DVar1);
    this->m_pvImmutableData = pvVar2;
    if (this->m_pvImmutableData == (VOID *)0x0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      local_24 = 0xe;
      goto LAB_003b03ac;
    }
    pvVar2 = this->m_pvImmutableData;
    DVar1 = CObjectType::GetImmutableDataSize(this->m_pot);
    memset(pvVar2,0,(ulong)DVar1);
  }
  DVar1 = CObjectType::GetProcessLocalDataSize(this->m_pot);
  if (DVar1 != 0) {
    local_24 = CSimpleDataLock::Initialize(&this->m_sdlLocalData);
    if (local_24 != 0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      goto LAB_003b03ac;
    }
    DVar1 = CObjectType::GetProcessLocalDataSize(this->m_pot);
    pvVar2 = InternalMalloc((ulong)DVar1);
    this->m_pvLocalData = pvVar2;
    if (this->m_pvLocalData == (VOID *)0x0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      local_24 = 0xe;
      goto LAB_003b03ac;
    }
    pvVar2 = this->m_pvLocalData;
    DVar1 = CObjectType::GetProcessLocalDataSize(this->m_pot);
    memset(pvVar2,0,(ulong)DVar1);
  }
  DVar1 = CPalString::GetStringLength(&poa->sObjectName);
  if (DVar1 != 0) {
    local_24 = CPalString::CopyString(&(this->m_oa).sObjectName,&poa->sObjectName);
  }
LAB_003b03ac:
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return local_24;
  }
  abort();
}

Assistant:

PAL_ERROR
CPalObjectBase::Initialize(
    CPalThread *pthr,
    CObjectAttributes *poa
    )
{
    PAL_ERROR palError = NO_ERROR;

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != poa);

    ENTRY("CPalObjectBase::Initialize"
        "(this = %p, pthr = %p, poa = %p)\n",
        this,
        pthr,
        poa
        );

    if (0 != m_pot->GetImmutableDataSize())
    {
        m_pvImmutableData = InternalMalloc(m_pot->GetImmutableDataSize());
        if (NULL != m_pvImmutableData)
        {
            ZeroMemory(m_pvImmutableData, m_pot->GetImmutableDataSize());
        }
        else
        {
            ERROR("Unable to allocate immutable data\n");
            palError = ERROR_OUTOFMEMORY;
            goto IntializeExit;
        }
    }

    if (0 != m_pot->GetProcessLocalDataSize())
    {
        palError = m_sdlLocalData.Initialize();
        if (NO_ERROR != palError)
        {
            ERROR("Unable to initialize local data lock!\n");
            goto IntializeExit;
        }
        
        m_pvLocalData = InternalMalloc(m_pot->GetProcessLocalDataSize());
        if (NULL != m_pvLocalData)
        {
            ZeroMemory(m_pvLocalData, m_pot->GetProcessLocalDataSize());
        }
        else
        {
            ERROR("Unable to allocate local data\n");
            palError = ERROR_OUTOFMEMORY;
            goto IntializeExit;
        }
    }

    if (0 != poa->sObjectName.GetStringLength())
    {
        palError = m_oa.sObjectName.CopyString(&poa->sObjectName);
    }

IntializeExit:

    LOGEXIT("CPalObjectBase::Initialize returns %d\n", palError);

    return palError;
}